

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

UInt32 * crnlib::GetMatchesSpec1
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  UInt32 UVar4;
  uint uVar5;
  UInt32 *pUVar6;
  uint uVar7;
  UInt32 *pUVar8;
  bool bVar9;
  UInt32 local_58;
  uint local_54;
  UInt32 *local_50;
  
  local_58 = maxLen;
  local_50 = son + _cyclicBufferPos * 2;
  pUVar8 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  local_54 = 0;
  uVar5 = 0;
  while ((bVar9 = cutValue != 0, cutValue = cutValue - 1, bVar9 &&
         (uVar1 = pos - curMatch, uVar1 < _cyclicBufferSize))) {
    UVar4 = 0;
    if (_cyclicBufferPos < uVar1) {
      UVar4 = _cyclicBufferSize;
    }
    uVar2 = uVar5;
    if (local_54 < uVar5) {
      uVar2 = local_54;
    }
    uVar3 = (ulong)uVar2;
    pUVar6 = son + (UVar4 + (_cyclicBufferPos - uVar1)) * 2;
    if (cur[uVar3 - uVar1] == cur[uVar3]) {
      uVar7 = uVar2 + 1;
      UVar4 = lenLimit;
      if ((uVar7 != lenLimit) && (UVar4 = uVar7, cur[(ulong)uVar7 - (ulong)uVar1] == cur[uVar7])) {
        uVar2 = uVar2 + 2;
        do {
          UVar4 = lenLimit;
          if (lenLimit == uVar2) break;
          uVar3 = (ulong)uVar2;
          UVar4 = uVar2;
          uVar2 = uVar2 + 1;
        } while (cur[uVar3 - uVar1] == cur[uVar3]);
      }
      if (local_58 < UVar4) {
        *distances = UVar4;
        distances[1] = uVar1 - 1;
        distances = distances + 2;
        local_58 = UVar4;
        if (UVar4 == lenLimit) {
          *local_50 = *pUVar6;
          UVar4 = pUVar6[1];
          goto LAB_001830ef;
        }
      }
      uVar3 = (ulong)UVar4;
    }
    if (cur[uVar3 - uVar1] < cur[uVar3]) {
      *local_50 = curMatch;
      pUVar6 = pUVar6 + 1;
      uVar5 = (uint)uVar3;
      local_50 = pUVar6;
    }
    else {
      *pUVar8 = curMatch;
      pUVar8 = pUVar6;
      local_54 = (uint)uVar3;
    }
    curMatch = *pUVar6;
  }
  *local_50 = 0;
  UVar4 = 0;
LAB_001830ef:
  *pUVar8 = UVar4;
  return distances;
}

Assistant:

UInt32* GetMatchesSpec1(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                        UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                        UInt32* distances, UInt32 maxLen) {
  CLzRef* ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef* ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize) {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return distances;
    }
    {
      CLzRef* pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte* pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len]) {
        if (++len != lenLimit && pb[len] == cur[len])
          while (++len != lenLimit)
            if (pb[len] != cur[len])
              break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit) {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return distances;
          }
        }
      }
      if (pb[len] < cur[len]) {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      } else {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}